

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int fits_copy_image2cell
              (fitsfile *fptr,fitsfile *newptr,char *colname,long rownum,int copykeyflag,int *status
              )

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  char *err_message;
  long nbytes;
  int colnum;
  uchar dummy;
  int local_7dac;
  long local_7da8;
  long local_7da0;
  ulong local_7d98;
  int naxis;
  int hdutype;
  int typecode1;
  int naxis1;
  int bitpix;
  int ncols;
  int hdunum;
  char tform [20];
  LONGLONG dataend;
  LONGLONG datastart;
  LONGLONG headstart;
  LONGLONG naxes1 [9];
  LONGLONG naxes [9];
  char card [81];
  char *patterns [43] [2];
  char local_7988 [1056];
  uchar buffer [30000];
  
  naxes1[6] = 0;
  naxes1[7] = 0;
  naxes1[4] = 0;
  naxes1[5] = 0;
  naxes1[2] = 0;
  naxes1[3] = 0;
  naxes1[0] = 0;
  naxes1[1] = 0;
  naxes1[8] = 0;
  dummy = '\0';
  memcpy(patterns,&PTR_anon_var_dwarf_12ecf_0025e880,0x2b0);
  if (0 < *status) {
    return *status;
  }
  if (fptr == (fitsfile *)0x0 || newptr == (fitsfile *)0x0) {
    *status = 0x73;
    return 0x73;
  }
  iVar1 = ffghdt(fptr,&hdutype,status);
  if (iVar1 < 1) {
    if (hdutype != 0) {
      ffpmsg("The input extension is not an image.");
      ffpmsg(" Cannot open the image.");
      *status = 0xe9;
      return 0xe9;
    }
    iVar1 = ffghdt(newptr,&hdutype,status);
    if (iVar1 < 1) {
      if (hdutype != 2) {
        ffpmsg("The output extension is not a table.");
        *status = 0xe3;
        return 0xe3;
      }
      iVar1 = ffgiprll(fptr,9,&bitpix,&naxis,naxes,status);
      if (iVar1 < 1) {
        local_7da8 = 1;
        if (0 < (long)naxis) {
          lVar4 = 0;
          do {
            local_7da8 = local_7da8 * naxes[lVar4];
            lVar4 = lVar4 + 1;
          } while (naxis != lVar4);
        }
        if (bitpix < 0x10) {
          if (bitpix == -0x40) {
            local_7da0 = local_7da8 * 8;
            local_7d98 = CONCAT44(local_7d98._4_4_,0x44);
            local_7dac = 0x52;
          }
          else if (bitpix == -0x20) {
            local_7da0 = local_7da8 * 4;
            local_7d98 = CONCAT44(local_7d98._4_4_,0x45);
            local_7dac = 0x2a;
          }
          else {
            if (bitpix != 8) {
LAB_001218be:
              ffpmsg("Error: the image has an invalid datatype.");
              *status = 0xd3;
              return 0xd3;
            }
            local_7d98 = CONCAT44(local_7d98._4_4_,0x42);
            local_7dac = 0xb;
            local_7da0 = local_7da8;
          }
        }
        else if (bitpix == 0x40) {
          local_7da0 = local_7da8 * 8;
          local_7d98 = CONCAT44(local_7d98._4_4_,0x4b);
          local_7dac = 0x51;
        }
        else if (bitpix == 0x20) {
          local_7da0 = local_7da8 * 4;
          local_7d98 = CONCAT44(local_7d98._4_4_,0x4a);
          local_7dac = 0x29;
        }
        else {
          if (bitpix != 0x10) goto LAB_001218be;
          local_7da0 = local_7da8 * 2;
          local_7d98 = CONCAT44(local_7d98._4_4_,0x49);
          local_7dac = 0x15;
        }
        ffpmrk();
        ffgcno(newptr,0,colname,&colnum,status);
        ffcmrk();
        if (*status == 0) {
          ffgtdmll(newptr,colnum,9,&naxis1,naxes1,status);
          if ((0 < *status) || (naxis != naxis1)) {
LAB_00121cbe:
            ffpmsg("Input image dimensions and output table cell dimensions do not match.");
            *status = 0x140;
            return 0x140;
          }
          if (0 < naxis) {
            uVar5 = 0;
            do {
              if (naxes[uVar5] != naxes1[uVar5]) goto LAB_00121cbe;
              uVar5 = uVar5 + 1;
            } while ((uint)naxis != uVar5);
          }
          ffgtclll(newptr,colnum,&typecode1,(LONGLONG *)tform,(LONGLONG *)&ncols,status);
          if (((0 < *status) || (typecode1 != local_7dac)) || (tform._0_8_ != local_7da8)) {
            ffpmsg("Input image data type does not match output table cell type.");
            *status = 0x105;
            return 0x105;
          }
        }
        else {
          *status = 0;
          snprintf(tform,0x14,"%.0f%c",(double)local_7da8,local_7d98 & 0xffffffff);
          ffgncl(newptr,&ncols,status);
          colnum = ncols + 1;
          fficol(newptr,colnum,colname,tform,status);
          ffptdmll(newptr,colnum,naxis,naxes,status);
          if (*status != 0) {
            err_message = "Could not insert new column into output table.";
            goto LAB_00121725;
          }
        }
        if (copykeyflag != 0) {
          if (copykeyflag == 2) {
            patterns[0x2a][1] = "-";
          }
          fits_translate_keywords(fptr,newptr,5,patterns,0x2b,colnum,0,0,status);
        }
        ffpcl(newptr,0xb,colnum,rownum,local_7da8,1,&dummy,status);
        local_7d98 = newptr->Fptr->tableptr[(long)colnum + -1].tbcol + 1;
        ffghadll(fptr,&headstart,&datastart,&dataend,status);
        local_7da8 = datastart;
        snprintf(card,0x51,"HISTORY  Table column \'%s\' row %ld copied from image",colname,rownum);
        hdunum = 0;
        builtin_strncpy(local_7988,"HISTORY   ",0xb);
        sVar2 = strlen(local_7988);
        ffflnm(fptr,local_7988 + sVar2,status);
        ffghdn(fptr,&hdunum);
        sVar2 = strlen(local_7988);
        snprintf(local_7988 + sVar2,0x415 - sVar2,"[%d]",(ulong)(hdunum - 1));
        ffflsh(fptr,0,status);
        ffmbyt(fptr,local_7da8,1,status);
        lVar4 = 30000;
        if (local_7da0 < 30000) {
          lVar4 = local_7da0;
        }
        ffgbyt(fptr,lVar4,buffer,status);
        uVar5 = local_7d98;
        ffptbb(newptr,rownum,local_7d98,lVar4,buffer,status);
        lVar3 = local_7da0 - lVar4;
        if (lVar3 != 0) {
          lVar4 = uVar5 + lVar4;
          do {
            if (0 < *status) break;
            nbytes = 30000;
            if (lVar3 < 30000) {
              nbytes = lVar3;
            }
            local_7da0 = lVar3;
            ffread(fptr->Fptr,nbytes,buffer,status);
            ffptbb(newptr,rownum,lVar4,nbytes,buffer,status);
            lVar4 = lVar4 + nbytes;
            lVar3 = local_7da0 - nbytes;
          } while (lVar3 != 0);
        }
        ffrdef(newptr,status);
        goto LAB_0012172a;
      }
      err_message = "Could not read image parameters.";
    }
    else {
      err_message = "could not get output HDU type";
    }
  }
  else {
    err_message = "could not get input HDU type";
  }
LAB_00121725:
  ffpmsg(err_message);
LAB_0012172a:
  return *status;
}

Assistant:

int fits_copy_image2cell(
	   fitsfile *fptr,   /* I - pointer to input image extension */
	   fitsfile *newptr, /* I - pointer to output table */
           char *colname,    /* I - name of column containing the image    */
           long rownum,      /* I - number of the row containing the image */
           int copykeyflag,  /* I - controls which keywords to copy */
           int *status)      /* IO - error status */

/* 
   Copy an image extension into a table cell at a given row and
   column.  The table must have already been created.  If the "colname"
   column exists, it will be used, otherwise a new column will be created
   in the table.

   The "copykeyflag" parameter controls which keywords to copy from the 
   input image to the output table header (with any appropriate translation).
 
   copykeyflag = 0  -- no keywords will be copied
   copykeyflag = 1  -- essentially all keywords will be copied
   copykeyflag = 2  -- copy only the WCS related keywords 
   
  This routine was written by Craig Markwardt, GSFC

*/
{
    tcolumn *colptr;
    unsigned char buffer[30000];
    int ii, hdutype, colnum, typecode, bitpix, naxis, ncols, hdunum;
    char tformchar, tform[20], card[FLEN_CARD];
    LONGLONG imgstart, naxes[9], nbytes, repeat, ntodo,firstbyte;
    char filename[FLEN_FILENAME+20];

    int npat;

    int naxis1;
    LONGLONG naxes1[9] = {0,0,0,0,0,0,0,0,0}, repeat1, width1;
    int typecode1;
    unsigned char dummy = 0;

    LONGLONG headstart, datastart, dataend;

    /* Image-to-table keyword translation table  */
    /*                        INPUT      OUTPUT  */
    /*                       01234567   01234567 */
    char *patterns[][2] = {{"BSCALE",  "TSCALn"  },  /* Standard FITS keywords */
			   {"BZERO",   "TZEROn"  },
			   {"BUNIT",   "TUNITn"  },
			   {"BLANK",   "TNULLn"  },
			   {"DATAMIN", "TDMINn"  },
			   {"DATAMAX", "TDMAXn"  },
			   {"CTYPEi",  "iCTYPn"  },  /* Coordinate labels */
			   {"CTYPEia", "iCTYna"  },
			   {"CUNITi",  "iCUNIn"  },  /* Coordinate units */
			   {"CUNITia", "iCUNna"  },
			   {"CRVALi",  "iCRVLn"  },  /* WCS keywords */
			   {"CRVALia", "iCRVna"  },
			   {"CDELTi",  "iCDLTn"  },
			   {"CDELTia", "iCDEna"  },
			   {"CRPIXj",  "jCRPXn"  },
			   {"CRPIXja", "jCRPna"  },
			   {"PCi_ja",  "ijPCna"  },
			   {"CDi_ja",  "ijCDna"  },
			   {"PVi_ma",  "iVn_ma"  },
			   {"PSi_ma",  "iSn_ma"  },
			   {"WCSAXESa","WCAXna"  },
			   {"WCSNAMEa","WCSNna"  },
			   {"CRDERia", "iCRDna"  },
			   {"CSYERia", "iCSYna"  },
			   {"CROTAi",  "iCROTn"  },

			   {"LONPOLEa","LONPna"},
			   {"LATPOLEa","LATPna"},
			   {"EQUINOXa","EQUIna"},
			   {"MJD-OBS", "MJDOBn" },
			   {"MJD-AVG", "MJDAn" },
			   {"RADESYSa","RADEna"},
			   {"CNAMEia", "iCNAna"  },
			   {"DATE-AVG","DAVGn"},

			   {"NAXISi",  "-"       },  /* Remove structural keywords*/
			   {"PCOUNT",  "-"       },
			   {"GCOUNT",  "-"       },
			   {"EXTEND",  "-"       },
			   {"EXTNAME", "-"       },
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   {"*",       "+"       }}; /* copy all other keywords */

    
    if (*status > 0)
        return(*status);

    if (fptr == 0 || newptr == 0) return (*status = NULL_INPUT_PTR);

    if (ffghdt(fptr, &hdutype, status) > 0) {
      ffpmsg("could not get input HDU type");
      return (*status);
    }

    if (hdutype != IMAGE_HDU) {
        ffpmsg("The input extension is not an image.");
        ffpmsg(" Cannot open the image.");
        return(*status = NOT_IMAGE);
    }

    if (ffghdt(newptr, &hdutype, status) > 0) {
      ffpmsg("could not get output HDU type");
      return (*status);
    }

    if (hdutype != BINARY_TBL) {
        ffpmsg("The output extension is not a table.");
        return(*status = NOT_BTABLE);
    }


    if (ffgiprll(fptr, 9, &bitpix, &naxis, naxes, status) > 0) {
      ffpmsg("Could not read image parameters.");
      return (*status);
    }

    /* Determine total number of pixels in the image */
    repeat = 1;
    for (ii = 0; ii < naxis; ii++) repeat *= naxes[ii];

    /* Determine the TFORM value for the table cell */
    if (bitpix == BYTE_IMG) {
      typecode = TBYTE;
      tformchar = 'B';
      nbytes = repeat;
    } else if (bitpix == SHORT_IMG) {
      typecode = TSHORT;
      tformchar = 'I';
      nbytes = repeat*2;
    } else if (bitpix == LONG_IMG) {
      typecode = TLONG;
      tformchar = 'J';
      nbytes = repeat*4;
    } else if (bitpix == FLOAT_IMG) {
      typecode = TFLOAT;
      tformchar = 'E';
      nbytes = repeat*4;
    } else if (bitpix == DOUBLE_IMG) {
      typecode = TDOUBLE;
      tformchar = 'D';
      nbytes = repeat*8;
    } else if (bitpix == LONGLONG_IMG) {
      typecode = TLONGLONG;
      tformchar = 'K';
      nbytes = repeat*8;
    } else {
      ffpmsg("Error: the image has an invalid datatype.");
      return (*status = BAD_BITPIX);
    }

    /* get column number */
    ffpmrk();
    ffgcno(newptr, CASEINSEN, colname, &colnum, status);
    ffcmrk();

    /* Column does not exist; create it */
    if (*status) {

      *status = 0;
      snprintf(tform, 20, "%.0f%c", (double) repeat, tformchar);
      ffgncl(newptr, &ncols, status);
      colnum = ncols+1;
      fficol(newptr, colnum, colname, tform, status);
      ffptdmll(newptr, colnum, naxis, naxes, status);
      
      if (*status) {
	ffpmsg("Could not insert new column into output table.");
	return *status;
      }

    } else {

      ffgtdmll(newptr, colnum, 9, &naxis1, naxes1, status);
      if (*status > 0 || naxis != naxis1) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }
      for (ii=0; ii<naxis; ii++) if (naxes[ii] != naxes1[ii]) {
	ffpmsg("Input image dimensions and output table cell dimensions do not match.");
	return (*status = BAD_DIMEN);
      }

      ffgtclll(newptr, colnum, &typecode1, &repeat1, &width1, status);
      if ((*status > 0) || (typecode1 != typecode) || (repeat1 != repeat)) {
	ffpmsg("Input image data type does not match output table cell type.");
	return (*status = BAD_TFORM);
      }
    }

    /* copy keywords from input image to output table, if required */
    
    if (copykeyflag) {
    
      npat = sizeof(patterns)/sizeof(patterns[0][0])/2;

      if (copykeyflag == 2) {   /* copy only the WCS-related keywords */
	patterns[npat-1][1] = "-";
      }

      /* The 3rd parameter value = 5 means skip the first 4 keywords in the image */
      fits_translate_keywords(fptr, newptr, 5, patterns, npat,
			      colnum, 0, 0, status);
    }

    /* Here is all the code to compute offsets:
     *     * byte offset from start of row to column (dest table)
     *     * byte offset from start of file to image data (source image)
     */   
 
    /* Force the writing of the row of the table by writing the last byte of
        the array, which grows the table, and/or shifts following extensions */
    ffpcl(newptr, TBYTE, colnum, rownum, repeat, 1, &dummy, status);

    /* byte offset within the row to the start of the image column */
    colptr  = (newptr->Fptr)->tableptr;   /* point to first column */
    colptr += (colnum - 1);     /* offset to correct column structure */
    firstbyte = colptr->tbcol + 1; 

    /* get starting address of input image to be read */
    ffghadll(fptr, &headstart, &datastart, &dataend, status);
    imgstart = datastart;

    snprintf(card, FLEN_CARD, "HISTORY  Table column '%s' row %ld copied from image",
	    colname, rownum);
/*
  Don't automatically write History keywords; leave this up to the caller. 
    ffprec(newptr, card, status);
*/

    /* write HISTORY keyword with the file name (this is now disabled)*/

    filename[0] = '\0'; hdunum = 0;
    strcpy(filename, "HISTORY   ");
    ffflnm(fptr, filename+strlen(filename), status);
    ffghdn(fptr, &hdunum);
    snprintf(filename+strlen(filename),FLEN_FILENAME+20-strlen(filename),"[%d]", hdunum-1);
/*
    ffprec(newptr, filename, status);
*/

    /* the use of ffread routine, below, requires that any 'dirty' */
    /* buffers in memory be flushed back to the file first */
    
    ffflsh(fptr, FALSE, status);

    /* move to the first byte of the input image */
    ffmbyt(fptr, imgstart, TRUE, status);

    ntodo = minvalue(30000L, nbytes);
    ffgbyt(fptr, ntodo, buffer, status);  /* read input image */
    ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status); /* write to table */

    nbytes    -= ntodo;
    firstbyte += ntodo;


    /* read any additional bytes with low-level ffread routine, for speed */
    while (nbytes && (*status <= 0) )
    {
        ntodo = minvalue(30000L, nbytes);
        ffread(fptr->Fptr, (long) ntodo, buffer, status);
        ffptbb(newptr, rownum, firstbyte, ntodo, buffer, status);
        nbytes    -= ntodo;
        firstbyte += ntodo;
    }

    /* Re-scan the header so that CFITSIO knows about all the new keywords */
    ffrdef(newptr,status);

    return(*status);
}